

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QTreeViewItem>::data(QList<QTreeViewItem> *this)

{
  QArrayDataPointer<QTreeViewItem> *this_00;
  QTreeViewItem *pQVar1;
  QArrayDataPointer<QTreeViewItem> *in_RDI;
  
  detach((QList<QTreeViewItem> *)0x90448c);
  this_00 = (QArrayDataPointer<QTreeViewItem> *)QArrayDataPointer<QTreeViewItem>::operator->(in_RDI)
  ;
  pQVar1 = QArrayDataPointer<QTreeViewItem>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }